

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelDISTANCE,fe::PixelB8G8R8A8>
               (op_blend_one_invSrcAlpha *op,PixelDISTANCE *srcPixelFormat,
               PixelB8G8R8A8 *destPixelFormat,ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int x;
  int x_00;
  uint8_t *destData;
  uint8_t *puVar4;
  int y;
  int y_00;
  uint8_t *srcData;
  uint8_t *puVar5;
  
  bVar3 = check(src,dest);
  if (bVar3) {
    puVar5 = (src->super_fe_image).data;
    puVar4 = (dest->super_fe_image).data;
    iVar1 = (dest->super_fe_image).w;
    iVar2 = (dest->super_fe_image).h;
    for (y_00 = 0; y_00 != iVar2; y_00 = y_00 + 1) {
      destData = puVar4;
      srcData = puVar5;
      for (x_00 = 0; iVar1 != x_00; x_00 = x_00 + 1) {
        op_blend_one_invSrcAlpha::operator()
                  (op,srcPixelFormat,destPixelFormat,srcData,destData,x_00,y_00);
        destData = destData + (dest->super_fe_image).bytespp;
        srcData = srcData + (src->super_fe_image).bytespp;
      }
      puVar5 = puVar5 + (src->super_fe_image).pitch;
      puVar4 = puVar4 + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }